

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::run(FuzzHelper *this)

{
  doChecks(this);
  return;
}

Assistant:

void
FuzzHelper::run()
{
    try {
        doChecks();
    } catch (std::runtime_error const& e) {
        std::cerr << "runtime_error: " << e.what() << std::endl;
    }
}